

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfobjs.c
# Opt level: O3

FT_Error sfnt_init_face(FT_Stream stream,TT_Face face,FT_Int face_instance_index,FT_Int num_params,
                       FT_Parameter *params)

{
  byte *pbVar1;
  FT_Library library;
  uchar *puVar2;
  ulong uVar3;
  ulong uVar4;
  size_t input_len;
  ushort uVar5;
  uint uVar6;
  FT_UShort FVar7;
  FT_UShort FVar8;
  int iVar9;
  FT_Error FVar10;
  uint uVar11;
  int iVar12;
  undefined8 *puVar13;
  FT_Pointer pvVar14;
  FT_Module pFVar15;
  FT_ULong FVar16;
  FT_ULong FVar17;
  ulong *puVar18;
  FT_ULong *pFVar19;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  undefined6 extraout_var_01;
  TTC_HeaderRec *pTVar20;
  FT_Stream pFVar21;
  byte bVar22;
  ulong cur_count;
  int iVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  FT_Driver module;
  ulong uVar28;
  FT_Memory pFVar29;
  FT_Stream pFVar30;
  FT_Byte *pFVar31;
  FT_Error error;
  WOFF_HeaderRec woff;
  FT_Error local_f4;
  uint local_f0;
  FT_Error local_ec;
  ulong *local_e8;
  FT_Byte *local_e0;
  ulong local_d8;
  FT_Stream local_d0;
  FT_Stream local_c8;
  undefined8 *local_c0;
  TTC_HeaderRec *local_b8;
  FT_Memory local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  FT_Byte local_90;
  FT_Byte FStack_8f;
  FT_Byte FStack_8e;
  FT_Byte FStack_8d;
  undefined4 uStack_8c;
  ulong local_88;
  undefined2 local_80;
  ulong local_78;
  ulong local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  uVar28 = (ulong)(uint)face_instance_index;
  module = (face->root).driver;
  library = (module->root).library;
  puVar13 = (undefined8 *)face->sfnt;
  if (puVar13 == (undefined8 *)0x0) {
    puVar13 = (undefined8 *)FT_Get_Module_Interface(library,"sfnt");
    if (puVar13 == (undefined8 *)0x0) {
      return 0xb;
    }
    face->sfnt = puVar13;
    face->goto_table = (TT_Loader_GotoTableFunc)*puVar13;
    module = (face->root).driver;
  }
  pvVar14 = ft_module_get_service(&module->root,"postscript-cmaps",'\x01');
  face->psnames = pvVar14;
  if (face->mm == (void *)0x0) {
    pFVar15 = FT_Get_Module(library,"truetype");
    pvVar14 = ft_module_get_service(pFVar15,"multi-masters",'\0');
    face->mm = pvVar14;
  }
  if (face->var == (void *)0x0) {
    pFVar15 = FT_Get_Module(library,"truetype");
    pvVar14 = ft_module_get_service(pFVar15,"metrics-variations",'\0');
    face->var = pvVar14;
  }
  local_b0 = stream->memory;
  (face->ttc_header).tag = 0;
  (face->ttc_header).version = 0;
  (face->ttc_header).count = 0;
  FVar16 = FT_Stream_Pos(stream);
  FVar17 = FT_Stream_ReadULong(stream,&local_ec);
  if (local_ec != 0) {
    return local_ec;
  }
  local_b8 = &face->ttc_header;
LAB_0015d8fc:
  uVar24 = (uint)uVar28;
  if (FVar17 == 0x774f4646) {
    local_ec = FT_Stream_Seek(stream,FVar16);
    if (local_ec != 0) {
      return local_ec;
    }
    pFVar29 = stream->memory;
    local_f4 = FT_Stream_ReadFields
                         (stream,(FT_Frame_Field *)woff_open_font_woff_header_fields,&local_98);
    if (local_f4 != 0) {
      return local_f4;
    }
    lVar25 = CONCAT44(uStack_8c,CONCAT13(FStack_8d,CONCAT12(FStack_8e,CONCAT11(FStack_8f,local_90)))
                     );
    if (lVar25 == 0x74746366) {
      return 8;
    }
    if (lVar25 == 0x774f4646) {
      return 8;
    }
    if (local_88 != stream->size) {
      return 8;
    }
    if (local_80 == 0) {
      return 8;
    }
    if (local_88 <= (ulong)local_80 * 0x14 + 0x2c) {
      return 8;
    }
    uVar27 = (ulong)local_80 << 4 | 0xc;
    if (local_78 <= uVar27) {
      return 8;
    }
    if ((local_78 & 3) != 0) {
      return 8;
    }
    if (local_68 == 0) {
      if (local_60 != 0 || local_58 != 0) {
        return 8;
      }
    }
    else if ((local_60 != 0) && (local_58 == 0)) {
      return 8;
    }
    if ((local_50 == 0) && (local_48 != 0)) {
      return 8;
    }
    local_e0 = (FT_Byte *)ft_mem_alloc(pFVar29,uVar27,&local_f4);
    if (local_f4 != 0) {
      puVar18 = (ulong *)0x0;
      pFVar21 = (FT_Stream)0x0;
      pFVar30 = (FT_Stream)0x0;
      goto LAB_0015db25;
    }
    local_c8 = (FT_Stream)ft_mem_alloc(pFVar29,0x50,&local_f4);
    if (local_f4 == 0) {
      uVar5 = local_80 >> 1;
      if (uVar5 == 0) {
        bVar22 = 0x20;
      }
      else {
        iVar9 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        bVar22 = (byte)iVar9 ^ 0x1f;
      }
      bVar22 = 0x20 - bVar22 | (byte)-(uint)(local_80 == 0);
      iVar23 = 0x10 << (bVar22 & 0x1f);
      iVar9 = (uint)local_80 * 0x10 - iVar23;
      *local_e0 = FStack_8d;
      local_e0[1] = FStack_8e;
      local_e0[2] = FStack_8f;
      local_e0[3] = local_90;
      local_e0[4] = local_80._1_1_;
      local_e0[5] = (FT_Byte)local_80;
      local_e0[6] = (FT_Byte)((uint)iVar23 >> 8);
      local_e0[7] = (FT_Byte)iVar23;
      local_e0[8] = (FT_Byte)(-(uint)(local_80 == 0) >> 8);
      local_e0[9] = bVar22;
      local_e0[10] = (FT_Byte)((uint)iVar9 >> 8);
      local_e0[0xb] = (FT_Byte)iVar9;
      local_c0 = puVar13;
      puVar18 = (ulong *)ft_mem_realloc(pFVar29,0x30,0,(ulong)local_80,(void *)0x0,&local_f4);
      puVar13 = local_c0;
      if (local_f4 != 0) goto LAB_0015db20;
      local_e8 = puVar18;
      local_d0 = (FT_Stream)ft_mem_realloc(pFVar29,8,0,(ulong)local_80,(void *)0x0,&local_f4);
      puVar13 = local_c0;
      puVar18 = local_e8;
      pFVar21 = local_d0;
      pFVar30 = local_c8;
      if ((local_f4 == 0) &&
         (local_f4 = FT_Stream_EnterFrame(stream,(ulong)local_80 * 0x14), puVar13 = local_c0,
         puVar18 = local_e8, pFVar21 = local_d0, pFVar30 = local_c8, local_f4 == 0)) {
        if (local_80 != 0) {
          uVar26 = 0;
          uVar27 = 0;
          do {
            local_a8 = uVar27;
            FVar16 = FT_Stream_GetULong(stream);
            *puVar18 = FVar16;
            FVar16 = FT_Stream_GetULong(stream);
            puVar18[1] = FVar16;
            FVar16 = FT_Stream_GetULong(stream);
            puVar18[2] = FVar16;
            FVar16 = FT_Stream_GetULong(stream);
            puVar18[3] = FVar16;
            FVar16 = FT_Stream_GetULong(stream);
            puVar18[4] = FVar16;
            uVar27 = *puVar18;
            if (uVar27 <= local_a8) {
              FT_Stream_ExitFrame(stream);
              local_f4 = 8;
              puVar13 = local_c0;
              puVar18 = local_e8;
              pFVar21 = local_d0;
              pFVar30 = local_c8;
              goto LAB_0015db25;
            }
            (&local_d0->base)[uVar26] = (uchar *)puVar18;
            uVar26 = uVar26 + 1;
            puVar18 = puVar18 + 6;
          } while (uVar26 < local_80);
        }
        local_f0 = uVar24;
        FT_Stream_ExitFrame(stream);
        qsort(local_d0,(ulong)local_80,8,compare_offsets);
        puVar13 = local_c0;
        cur_count = (ulong)local_80 << 4 | 0xc;
        uVar27 = (ulong)local_80 * 0x14 + 0x2c;
        uVar26 = cur_count;
        if (local_80 != 0) {
          uVar28 = 0;
          do {
            puVar2 = (&local_d0->base)[uVar28];
            if (*(ulong *)(puVar2 + 8) != uVar27) goto LAB_0015dffb;
            uVar3 = *(ulong *)(puVar2 + 0x10);
            if ((local_88 < uVar3) || (local_88 - uVar3 < uVar27)) goto LAB_0015dffb;
            uVar4 = *(ulong *)(puVar2 + 0x18);
            if ((uVar4 < uVar3) || ((local_78 < uVar4 || (local_78 - uVar4 < uVar26))))
            goto LAB_0015dffb;
            *(ulong *)(puVar2 + 0x28) = uVar26;
            uVar27 = uVar27 + ((int)uVar3 + 3U & 0xfffffffc);
            uVar26 = uVar26 + ((int)uVar4 + 3U & 0xfffffffc);
            uVar28 = uVar28 + 1;
          } while (local_80 != uVar28);
        }
        if ((local_68 == 0) ||
           ((local_68 == uVar27 && (uVar27 = uVar27 + local_60, uVar27 <= local_88)))) {
          uVar28 = (ulong)local_f0;
          if (((local_50 == 0) ||
              ((local_50 == ((int)uVar27 + 3U & 0xfffffffc) &&
               (uVar27 = local_50 + local_48, uVar27 <= local_88)))) &&
             ((uVar26 == local_78 && (uVar27 == local_88)))) {
            local_e0 = (FT_Byte *)ft_mem_realloc(pFVar29,1,cur_count,uVar26,local_e0,&local_f4);
            puVar18 = local_e8;
            pFVar21 = local_d0;
            pFVar30 = local_c8;
            if (local_f4 == 0) {
              if (local_80 != 0) {
                pFVar31 = local_e0 + 0xc;
                puVar18 = local_e8 + 5;
                uVar28 = 0;
                do {
                  *pFVar31 = *(FT_Byte *)((long)puVar18 + -0x25);
                  pFVar31[1] = *(FT_Byte *)((long)puVar18 + -0x26);
                  pFVar31[2] = *(FT_Byte *)((long)puVar18 + -0x27);
                  pFVar31[3] = (FT_Byte)puVar18[-5];
                  pFVar31[4] = *(FT_Byte *)((long)puVar18 + -5);
                  pFVar31[5] = *(FT_Byte *)((long)puVar18 + -6);
                  pFVar31[6] = *(FT_Byte *)((long)puVar18 + -7);
                  pFVar31[7] = (FT_Byte)puVar18[-1];
                  pFVar31[8] = *(FT_Byte *)((long)puVar18 + 3);
                  pFVar31[9] = *(FT_Byte *)((long)puVar18 + 2);
                  pFVar31[10] = *(FT_Byte *)((long)puVar18 + 1);
                  pFVar31[0xb] = (FT_Byte)*puVar18;
                  pFVar31[0xc] = *(FT_Byte *)((long)puVar18 + -0xd);
                  pFVar31[0xd] = *(FT_Byte *)((long)puVar18 + -0xe);
                  pFVar31[0xe] = *(FT_Byte *)((long)puVar18 + -0xf);
                  pFVar31[0xf] = (FT_Byte)puVar18[-2];
                  local_f4 = FT_Stream_Seek(stream,puVar18[-4]);
                  if ((local_f4 != 0) ||
                     (local_f4 = FT_Stream_EnterFrame(stream,puVar18[-3]), local_f4 != 0))
                  goto LAB_0015e003;
                  input_len = puVar18[-3];
                  if (input_len == puVar18[-2]) {
                    memcpy(local_e0 + *puVar18,stream->cursor,input_len);
                  }
                  else {
                    local_d8 = puVar18[-2];
                    local_f4 = FT_Gzip_Uncompress(pFVar29,local_e0 + *puVar18,&local_d8,
                                                  stream->cursor,input_len);
                    if (local_f4 != 0) goto LAB_0015e003;
                    if (local_d8 != puVar18[-2]) goto LAB_0015dffb;
                  }
                  FT_Stream_ExitFrame(stream);
                  uVar27 = puVar18[-2] + *puVar18;
                  if ((uVar27 & 3) != 0) {
                    memset(local_e0 + uVar27,0,(ulong)(~(uint)puVar18[-2] - (int)*puVar18 & 3) + 1);
                  }
                  uVar28 = uVar28 + 1;
                  puVar18 = puVar18 + 6;
                  pFVar31 = pFVar31 + 0x10;
                } while (uVar28 < local_80);
              }
              pFVar30 = local_c8;
              FT_Stream_OpenMemory(local_c8,local_e0,local_78);
              pFVar30->memory = stream->memory;
              pFVar30->close = sfnt_stream_close;
              FT_Stream_Free((face->root).stream,(uint)(face->root).face_flags >> 10 & 1);
              (face->root).stream = pFVar30;
              pbVar1 = (byte *)((long)&(face->root).face_flags + 1);
              *pbVar1 = *pbVar1 & 0xfb;
              uVar28 = (ulong)local_f0;
              puVar13 = local_c0;
              puVar18 = local_e8;
              pFVar21 = local_d0;
            }
            goto LAB_0015db25;
          }
        }
        uVar28 = (ulong)local_f0;
        local_f4 = 8;
        puVar18 = local_e8;
        pFVar21 = local_d0;
        pFVar30 = local_c8;
      }
    }
    else {
      puVar18 = (ulong *)0x0;
LAB_0015db20:
      pFVar21 = (FT_Stream)0x0;
      pFVar30 = local_c8;
    }
    goto LAB_0015db25;
  }
  if ((long)FVar17 < 0x74746366) {
    if ((long)FVar17 < 0x4f54544f) {
      if ((FVar17 != 0x10000) && (FVar17 != 0x20000)) {
        return 2;
      }
    }
    else if ((FVar17 != 0x4f54544f) && (FVar17 != 0x74727565)) {
      return 2;
    }
  }
  else if ((long)FVar17 < 0xa56b6264) {
    if ((FVar17 != 0x74746366) && (FVar17 != 0x74797031)) {
      return 2;
    }
  }
  else if ((FVar17 != 0xa56b6264) && (FVar17 != 0xa56c7374)) {
    return 2;
  }
  local_b8->tag = 0x74746366;
  if (FVar17 == 0x74746366) {
    local_ec = FT_Stream_ReadFields
                         (stream,(FT_Frame_Field *)sfnt_open_font_ttc_header_fields,local_b8);
    if (local_ec != 0) {
      return local_ec;
    }
    uVar27 = (face->ttc_header).count;
    if (uVar27 == 0) {
      return 8;
    }
    if (stream->size >> 5 < uVar27) {
      return 10;
    }
    pFVar19 = (FT_ULong *)ft_mem_realloc(local_b0,8,0,uVar27,(void *)0x0,&local_ec);
    (face->ttc_header).offsets = pFVar19;
    if (local_ec != 0) {
      return local_ec;
    }
    FVar10 = FT_Stream_EnterFrame(stream,(face->ttc_header).count << 2);
    if (FVar10 != 0) {
      return FVar10;
    }
    local_ec = 0;
    if (0 < (face->ttc_header).count) {
      lVar25 = 0;
      do {
        FVar16 = FT_Stream_GetULong(stream);
        (face->ttc_header).offsets[lVar25] = FVar16;
        lVar25 = lVar25 + 1;
      } while (lVar25 < (face->ttc_header).count);
    }
    FT_Stream_ExitFrame(stream);
    local_d8 = CONCAT44(local_d8._4_4_,local_ec);
    if (local_ec != 0) {
      return local_ec;
    }
  }
  else {
    (face->ttc_header).version = 0x10000;
    (face->ttc_header).count = 1;
    pFVar19 = (FT_ULong *)ft_mem_alloc(local_b0,8,&local_ec);
    (face->ttc_header).offsets = pFVar19;
    if (local_ec != 0) {
      return local_ec;
    }
    *pFVar19 = FVar16;
    local_d8 = local_d8 & 0xffffffff00000000;
  }
  uVar27 = (ulong)-uVar24;
  if (0 < (int)uVar24) {
    uVar27 = uVar28;
  }
  pFVar30 = (face->root).stream;
  iVar9 = ((int)uVar24 >> 0x1f) + ((uint)uVar27 & 0xffff);
  if ((face->ttc_header).count <= (long)iVar9) {
    if (-1 < (int)uVar24) {
      return 6;
    }
    iVar9 = 0;
  }
  FVar10 = FT_Stream_Seek(pFVar30,(face->ttc_header).offsets[iVar9]);
  if (FVar10 != 0) {
    return FVar10;
  }
  local_d8._0_4_ = FVar10;
  local_d8._0_4_ = (*(code *)puVar13[0x16])(face,pFVar30);
  if ((FT_Error)local_d8 != 0) {
    return (FT_Error)local_d8;
  }
  local_b0 = (face->root).memory;
  local_f0 = uVar24;
  FVar10 = (*face->goto_table)(face,0x66766172,pFVar30,&local_98);
  if (((FVar10 == 0) && (0x13 < local_98)) &&
     (FVar16 = FT_Stream_ReadULong(pFVar30,(FT_Error *)&local_d8), (FT_Error)local_d8 == 0)) {
    FVar7 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d8);
    local_b8 = (TTC_HeaderRec *)CONCAT62(local_b8._2_6_,FVar7);
    if ((((FT_Error)local_d8 != 0) ||
        (local_d8._0_4_ = FT_Stream_Skip(pFVar30,2), (FT_Error)local_d8 != 0)) ||
       (FVar7 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d8), (FT_Error)local_d8 != 0))
    goto LAB_0015e34b;
    FVar8 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d8);
    local_e0 = (FT_Byte *)CONCAT62(extraout_var,FVar8);
    if ((FT_Error)local_d8 != 0) goto LAB_0015e34b;
    FVar8 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d8);
    local_a0 = CONCAT62(extraout_var_00,FVar8);
    if ((FT_Error)local_d8 != 0) goto LAB_0015e34b;
    FVar8 = FT_Stream_ReadUShort(pFVar30,(FT_Error *)&local_d8);
    uVar28 = CONCAT62(extraout_var_01,FVar8);
    if ((FT_Error)local_d8 != 0) goto LAB_0015e34b;
    puVar18 = (ulong *)((ulong)local_b8 & 0xffff);
    pFVar31 = local_e0;
    uVar26 = local_a0;
  }
  else {
LAB_0015e34b:
    FVar16 = 0;
    puVar18 = (ulong *)0x0;
    FVar7 = 0;
    uVar28 = 0;
    pFVar31 = (FT_Byte *)0x0;
    uVar26 = 0;
  }
  pFVar29 = local_b0;
  if ((ushort)(FVar7 + 0xc001) < 0xc002 || ((short)pFVar31 != 0x14 || FVar16 != 0x10000)) {
    uVar26 = 0;
  }
  else {
    uVar11 = (uint)uVar28 & 0xffff;
    uVar24 = (uint)FVar7;
    uVar6 = (uint)uVar26;
    if (uVar24 * 4 + 4 == uVar11) {
      if ((uVar6 & 0xffff) < 0x7f00) {
LAB_0015e3f2:
        if ((long)puVar18 + (ulong)(uVar11 * (uVar6 & 0xffff)) + (ulong)(uVar24 * 0x14) <= local_98)
        {
          *(byte *)&face->variation_support = (byte)face->variation_support | 1;
          goto LAB_0015e416;
        }
      }
    }
    else if ((uVar6 & 0xffff) < 0x7f00 && uVar24 * 4 + 6 == uVar11) goto LAB_0015e3f2;
    uVar26 = 0;
  }
LAB_0015e416:
  if ((face->variation_support & 1) == 0) {
    pTVar20 = (TTC_HeaderRec *)0x0;
  }
  else {
    puVar13 = (undefined8 *)(ulong)((uint)FVar7 * 4);
    local_e8 = puVar18;
    local_e0 = pFVar31;
    local_a8 = (ulong)FVar7;
    local_38 = uVar28;
    pTVar20 = (TTC_HeaderRec *)ft_mem_alloc(local_b0,(FT_Long)puVar13,(FT_Error *)&local_d8);
    if ((FT_Error)local_d8 == 0) {
      local_b8 = pTVar20;
      local_a0 = uVar26;
      pFVar21 = (FT_Stream)ft_mem_alloc(pFVar29,(FT_Long)puVar13,(FT_Error *)&local_d8);
      pTVar20 = local_b8;
      uVar26 = local_a0;
      local_c8 = pFVar21;
      if ((FT_Error)local_d8 != 0) goto LAB_0015e462;
      local_40 = (ulong)local_e0 & 0xffff;
      local_c0 = puVar13;
      FVar16 = FT_Stream_Pos(pFVar30);
      puVar18 = (ulong *)((long)local_e8 + (FVar16 - 0x10));
      if ((int)local_a8 != 0) {
        pFVar31 = (FT_Byte *)((long)local_e8 + (FVar16 - 8));
        local_e0 = (FT_Byte *)(local_40 & 0xffffffff);
        uVar28 = local_a8 & 0xffffffff;
        pTVar20 = local_b8;
        local_e8 = puVar18;
        do {
          local_d8._0_4_ = FT_Stream_ReadAt(pFVar30,(FT_ULong)pFVar31,(FT_Byte *)pTVar20,4);
          pFVar31 = pFVar31 + (long)local_e0;
          pTVar20 = (TTC_HeaderRec *)((long)&pTVar20->tag + 4);
          uVar24 = (int)uVar28 - 1;
          uVar28 = (ulong)uVar24;
          puVar18 = local_e8;
        } while (uVar24 != 0);
      }
      local_e8 = puVar18;
      puVar13 = local_c0;
      local_e0 = (FT_Byte *)CONCAT44(local_e0._4_4_,(uint)(ushort)local_a0);
      if ((ushort)local_a0 == 0) {
        iVar9 = 0;
      }
      else {
        FVar16 = (long)local_e8 + (ulong)(uint)((int)local_40 * (int)local_a8) + 4;
        local_a8 = local_38 & 0xffff;
        iVar23 = 0;
        local_d0 = pFVar30;
        do {
          pFVar30 = local_c8;
          local_d8._0_4_ = FT_Stream_ReadAt(local_d0,FVar16,(FT_Byte *)local_c8,(FT_ULong)puVar13);
          iVar12 = bcmp(local_b8,pFVar30,(size_t)puVar13);
          pFVar30 = local_d0;
          iVar9 = iVar23;
          if (iVar12 == 0) break;
          FVar16 = FVar16 + local_a8;
          iVar23 = iVar23 + 1;
          iVar9 = (int)local_e0;
        } while ((int)local_e0 != iVar23);
      }
      pFVar21 = local_c8;
      pTVar20 = local_b8;
      uVar26 = (ulong)((int)local_a0 + (uint)(iVar9 == (int)local_e0));
      pFVar29 = local_b0;
      goto LAB_0015e462;
    }
  }
  pFVar21 = (FT_Stream)0x0;
LAB_0015e462:
  uVar24 = (uint)uVar26;
  ft_mem_free(pFVar29,pTVar20);
  ft_mem_free(pFVar29,pFVar21);
  FVar10 = (*face->goto_table)(face,0x676c7966,pFVar30,(FT_ULong *)0x0);
  if (((FVar10 != 0) &&
      (FVar10 = (*face->goto_table)(face,0x43464632,pFVar30,(FT_ULong *)0x0), FVar10 != 0)) &&
     (FVar10 = (*face->goto_table)(face,0x43464620,pFVar30,(FT_ULong *)0x0), FVar10 == 0)) {
    uVar24 = 0;
  }
  if ((uVar24 & 0xffff) < (uint)(uVar27 >> 0x10)) {
    if (-1 < (int)local_f0) {
      return 6;
    }
    uVar24 = 0;
  }
  (face->root).style_flags = (ulong)(uVar24 << 0x10);
  (face->root).num_faces = (face->ttc_header).count;
  (face->root).face_index = (long)(int)local_f0;
  return (FT_Error)local_d8;
LAB_0015dffb:
  local_f4 = 8;
LAB_0015e003:
  uVar28 = (ulong)local_f0;
  puVar13 = local_c0;
  puVar18 = local_e8;
  pFVar21 = local_d0;
  pFVar30 = local_c8;
LAB_0015db25:
  ft_mem_free(pFVar29,puVar18);
  ft_mem_free(pFVar29,pFVar21);
  if (local_f4 == 0) {
    local_ec = 0;
  }
  else {
    ft_mem_free(pFVar29,local_e0);
    FT_Stream_Close(pFVar30);
    ft_mem_free(pFVar29,pFVar30);
    local_ec = local_f4;
    if (local_f4 != 0) {
      return local_f4;
    }
  }
  stream = (face->root).stream;
  FVar16 = FT_Stream_Pos(stream);
  FVar17 = FT_Stream_ReadULong(stream,&local_ec);
  if (local_ec != 0) {
    return local_ec;
  }
  goto LAB_0015d8fc;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  sfnt_init_face( FT_Stream      stream,
                  TT_Face        face,
                  FT_Int         face_instance_index,
                  FT_Int         num_params,
                  FT_Parameter*  params )
  {
    FT_Error      error;
    FT_Library    library = face->root.driver->root.library;
    SFNT_Service  sfnt;
    FT_Int        face_index;


    /* for now, parameters are unused */
    FT_UNUSED( num_params );
    FT_UNUSED( params );


    sfnt = (SFNT_Service)face->sfnt;
    if ( !sfnt )
    {
      sfnt = (SFNT_Service)FT_Get_Module_Interface( library, "sfnt" );
      if ( !sfnt )
      {
        FT_ERROR(( "sfnt_init_face: cannot access `sfnt' module\n" ));
        return FT_THROW( Missing_Module );
      }

      face->sfnt       = sfnt;
      face->goto_table = sfnt->goto_table;
    }

    FT_FACE_FIND_GLOBAL_SERVICE( face, face->psnames, POSTSCRIPT_CMAPS );

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( !face->mm )
    {
      /* we want the MM interface from the `truetype' module only */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->mm = ft_module_get_service( tt_module,
                                        FT_SERVICE_ID_MULTI_MASTERS,
                                        0 );
    }

    if ( !face->var )
    {
      /* we want the metrics variations interface */
      /* from the `truetype' module only          */
      FT_Module  tt_module = FT_Get_Module( library, "truetype" );


      face->var = ft_module_get_service( tt_module,
                                         FT_SERVICE_ID_METRICS_VARIATIONS,
                                         0 );
    }
#endif

    FT_TRACE2(( "SFNT driver\n" ));

    error = sfnt_open_font( stream, face );
    if ( error )
      return error;

    /* Stream may have changed in sfnt_open_font. */
    stream = face->root.stream;

    FT_TRACE2(( "sfnt_init_face: %08p, %d\n", face, face_instance_index ));

    face_index = FT_ABS( face_instance_index ) & 0xFFFF;

    /* value -(N+1) requests information on index N */
    if ( face_instance_index < 0 )
      face_index--;

    if ( face_index >= face->ttc_header.count )
    {
      if ( face_instance_index >= 0 )
        return FT_THROW( Invalid_Argument );
      else
        face_index = 0;
    }

    if ( FT_STREAM_SEEK( face->ttc_header.offsets[face_index] ) )
      return error;

    /* check whether we have a valid TrueType file */
    error = sfnt->load_font_dir( face, stream );
    if ( error )
      return error;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    {
      FT_Memory  memory = face->root.memory;

      FT_ULong  fvar_len;

      FT_ULong  version;
      FT_ULong  offset;

      FT_UShort  num_axes;
      FT_UShort  axis_size;
      FT_UShort  num_instances;
      FT_UShort  instance_size;

      FT_Int  instance_index;

      FT_Byte*  default_values  = NULL;
      FT_Byte*  instance_values = NULL;


      instance_index = FT_ABS( face_instance_index ) >> 16;

      /* test whether current face is a GX font with named instances */
      if ( face->goto_table( face, TTAG_fvar, stream, &fvar_len ) ||
           fvar_len < 20                                          ||
           FT_READ_ULONG( version )                               ||
           FT_READ_USHORT( offset )                               ||
           FT_STREAM_SKIP( 2 ) /* reserved */                     ||
           FT_READ_USHORT( num_axes )                             ||
           FT_READ_USHORT( axis_size )                            ||
           FT_READ_USHORT( num_instances )                        ||
           FT_READ_USHORT( instance_size )                        )
      {
        version       = 0;
        offset        = 0;
        num_axes      = 0;
        axis_size     = 0;
        num_instances = 0;
        instance_size = 0;
      }

      /* check that the data is bound by the table length */
      if ( version != 0x00010000UL                    ||
           axis_size != 20                            ||
           num_axes == 0                              ||
           /* `num_axes' limit implied by 16-bit `instance_size' */
           num_axes > 0x3FFE                          ||
           !( instance_size == 4 + 4 * num_axes ||
              instance_size == 6 + 4 * num_axes )     ||
           /* `num_instances' limit implied by limited range of name IDs */
           num_instances > 0x7EFF                     ||
           offset                          +
             axis_size * num_axes          +
             instance_size * num_instances > fvar_len )
        num_instances = 0;
      else
        face->variation_support |= TT_FACE_FLAG_VAR_FVAR;

      /*
       *  As documented in the OpenType specification, an entry for the
       *  default instance may be omitted in the named instance table.  In
       *  particular this means that even if there is no named instance
       *  table in the font we actually do have a named instance, namely the
       *  default instance.
       *
       *  For consistency, we always want the default instance in our list
       *  of named instances.  If it is missing, we try to synthesize it
       *  later on.  Here, we have to adjust `num_instances' accordingly.
       */

      if ( ( face->variation_support & TT_FACE_FLAG_VAR_FVAR ) &&
           !( FT_ALLOC( default_values, num_axes * 4 )  ||
              FT_ALLOC( instance_values, num_axes * 4 ) )      )
      {
        /* the current stream position is 16 bytes after the table start */
        FT_ULong  array_start = FT_STREAM_POS() - 16 + offset;
        FT_ULong  default_value_offset, instance_offset;

        FT_Byte*  p;
        FT_UInt   i;


        default_value_offset = array_start + 8;
        p                    = default_values;

        for ( i = 0; i < num_axes; i++ )
        {
          (void)FT_STREAM_READ_AT( default_value_offset, p, 4 );

          default_value_offset += axis_size;
          p                    += 4;
        }

        instance_offset = array_start + axis_size * num_axes + 4;

        for ( i = 0; i < num_instances; i++ )
        {
          (void)FT_STREAM_READ_AT( instance_offset,
                                   instance_values,
                                   num_axes * 4 );

          if ( !ft_memcmp( default_values, instance_values, num_axes * 4 ) )
            break;

          instance_offset += instance_size;
        }

        if ( i == num_instances )
        {
          /* no default instance in named instance table; */
          /* we thus have to synthesize it                */
          num_instances++;
        }
      }

      FT_FREE( default_values );
      FT_FREE( instance_values );

      /* we don't support Multiple Master CFFs yet; */
      /* note that `glyf' or `CFF2' have precedence */
      if ( face->goto_table( face, TTAG_glyf, stream, 0 ) &&
           face->goto_table( face, TTAG_CFF2, stream, 0 ) &&
           !face->goto_table( face, TTAG_CFF, stream, 0 ) )
        num_instances = 0;

      /* instance indices in `face_instance_index' start with index 1, */
      /* thus `>' and not `>='                                         */
      if ( instance_index > num_instances )
      {
        if ( face_instance_index >= 0 )
          return FT_THROW( Invalid_Argument );
        else
          num_instances = 0;
      }

      face->root.style_flags = (FT_Long)num_instances << 16;
    }
#endif

    face->root.num_faces  = face->ttc_header.count;
    face->root.face_index = face_instance_index;

    return error;
  }